

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

bool __thiscall
solitaire::events::EventsProcessor::tryAddCardOnFoundationPileIfCollidesAndCheckIfHandEmpty
          (EventsProcessor *this,PileId *id,MouseLeftButtonUpEventData *eventData)

{
  Context *pCVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  bool local_31;
  PileId local_30;
  PileId local_2c;
  long *local_28;
  FoundationPileCollider *collider;
  MouseLeftButtonUpEventData *eventData_local;
  PileId *id_local;
  EventsProcessor *this_local;
  
  pCVar1 = this->context;
  collider = (FoundationPileCollider *)eventData;
  eventData_local = (MouseLeftButtonUpEventData *)id;
  id_local = (PileId *)this;
  piles::PileId::PileId(&local_2c,id);
  iVar2 = (*pCVar1->_vptr_Context[6])(pCVar1,&local_2c);
  local_28 = (long *)CONCAT44(extraout_var,iVar2);
  uVar3 = (**(code **)(*local_28 + 0x18))(local_28,collider + 2);
  local_31 = false;
  if ((uVar3 & 1) != 0) {
    piles::PileId::PileId(&local_30,id);
    local_31 = tryAddCardOnFoundationPileAndCheckIfHandEmpty
                         (this,&local_30,(MouseLeftButtonUpEventData *)collider);
  }
  return local_31;
}

Assistant:

bool EventsProcessor::tryAddCardOnFoundationPileIfCollidesAndCheckIfHandEmpty(
    const PileId id, const MouseLeftButtonUpEventData& eventData) const
{
    const auto& collider = context.getFoundationPileCollider(id);
    return collider.collidesWithCardsInHand(eventData.cardsInHandPosition) and
           tryAddCardOnFoundationPileAndCheckIfHandEmpty(id, eventData);
}